

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_has_jump(REF_GEOM ref_geom,REF_INT node,REF_BOOL *has_jump)

{
  REF_INT local_3c;
  REF_INT local_38;
  int local_34;
  REF_INT local_30;
  int local_2c;
  REF_INT geom;
  REF_INT item;
  REF_BOOL *has_jump_local;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  *has_jump = 0;
  if ((node < 0) || (ref_geom->ref_adj->nnode <= node)) {
    local_34 = -1;
  }
  else {
    local_34 = ref_geom->ref_adj->first[node];
  }
  local_2c = local_34;
  if (local_34 == -1) {
    local_38 = -1;
  }
  else {
    local_38 = ref_geom->ref_adj->item[local_34].ref;
  }
  local_30 = local_38;
  while( true ) {
    if (local_2c == -1) {
      return 0;
    }
    if (ref_geom->descr[local_30 * 6 + 3] != 0) break;
    local_2c = ref_geom->ref_adj->item[local_2c].next;
    if (local_2c == -1) {
      local_3c = -1;
    }
    else {
      local_3c = ref_geom->ref_adj->item[local_2c].ref;
    }
    local_30 = local_3c;
  }
  *has_jump = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_has_jump(REF_GEOM ref_geom, REF_INT node,
                                     REF_BOOL *has_jump) {
  REF_INT item, geom;
  *has_jump = REF_FALSE;
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (0 != ref_geom_jump(ref_geom, geom)) {
      *has_jump = REF_TRUE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}